

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GeneticAlgorithm.hpp
# Opt level: O3

void __thiscall
crsGA::
GeneticAlgorithm<Gen,_crsGA::Chromosome<Gen,_ComputeFitness>,_crsGA::Population<crsGA::Chromosome<Gen,_ComputeFitness>,_PopulationInitializationPolicy<crsGA::Chromosome<Gen,_ComputeFitness>_>_>,_crsGA::DefaultSelectionPolicy<crsGA::Chromosome<Gen,_ComputeFitness>,_crsGA::Population<crsGA::Chromosome<Gen,_ComputeFitness>,_PopulationInitializationPolicy<crsGA::Chromosome<Gen,_ComputeFitness>_>_>_>,_crsGA::DefaultCrossoverPolicy<crsGA::Chromosome<Gen,_ComputeFitness>_>,_crsGA::DefaultReplacementPolicy<crsGA::Chromosome<Gen,_ComputeFitness>,_crsGA::Population<crsGA::Chromosome<Gen,_ComputeFitness>,_PopulationInitializationPolicy<crsGA::Chromosome<Gen,_ComputeFitness>_>_>_>_>
::reset(GeneticAlgorithm<Gen,_crsGA::Chromosome<Gen,_ComputeFitness>,_crsGA::Population<crsGA::Chromosome<Gen,_ComputeFitness>,_PopulationInitializationPolicy<crsGA::Chromosome<Gen,_ComputeFitness>_>_>,_crsGA::DefaultSelectionPolicy<crsGA::Chromosome<Gen,_ComputeFitness>,_crsGA::Population<crsGA::Chromosome<Gen,_ComputeFitness>,_PopulationInitializationPolicy<crsGA::Chromosome<Gen,_ComputeFitness>_>_>_>,_crsGA::DefaultCrossoverPolicy<crsGA::Chromosome<Gen,_ComputeFitness>_>,_crsGA::DefaultReplacementPolicy<crsGA::Chromosome<Gen,_ComputeFitness>,_crsGA::Population<crsGA::Chromosome<Gen,_ComputeFitness>,_PopulationInitializationPolicy<crsGA::Chromosome<Gen,_ComputeFitness>_>_>_>_>
        *this)

{
  Chromosome<Gen,_ComputeFitness> *args_3;
  pointer pCVar1;
  pointer pGVar2;
  Logger *this_00;
  Gen *g;
  pointer pGVar3;
  Chromosome<Gen,_ComputeFitness> *c;
  pointer pCVar4;
  element_type *data;
  float local_34;
  
  data = (this->_data).super___shared_ptr<crsGA::UserData,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  pCVar4 = (this->_population)._chromosomes.
           super__Vector_base<crsGA::Chromosome<Gen,_ComputeFitness>,_std::allocator<crsGA::Chromosome<Gen,_ComputeFitness>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pCVar1 = (this->_population)._chromosomes.
           super__Vector_base<crsGA::Chromosome<Gen,_ComputeFitness>,_std::allocator<crsGA::Chromosome<Gen,_ComputeFitness>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (pCVar4 != pCVar1) {
    do {
      pGVar2 = (pCVar4->_genes).super__Vector_base<Gen,_std::allocator<Gen>_>._M_impl.
               super__Vector_impl_data._M_finish;
      for (pGVar3 = (pCVar4->_genes).super__Vector_base<Gen,_std::allocator<Gen>_>._M_impl.
                    super__Vector_impl_data._M_start; pGVar3 != pGVar2; pGVar3 = pGVar3 + 1) {
        (*(pGVar3->super_IGen)._vptr_IGen[3])(pGVar3,data);
      }
      pCVar4 = pCVar4 + 1;
    } while (pCVar4 != pCVar1);
    data = (this->_data).super___shared_ptr<crsGA::UserData,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  }
  Population<crsGA::Chromosome<Gen,_ComputeFitness>,_PopulationInitializationPolicy<crsGA::Chromosome<Gen,_ComputeFitness>_>_>
  ::calculateFitness(&this->_population,data);
  this_00 = getLogger();
  args_3 = (this->_population)._chromosomes.
           super__Vector_base<crsGA::Chromosome<Gen,_ComputeFitness>,_std::allocator<crsGA::Chromosome<Gen,_ComputeFitness>_>_>
           ._M_impl.super__Vector_impl_data._M_start + (this->_population)._fittestChromosomeIndex;
  local_34 = args_3->_fitness;
  Logger::debug<char[9],float,char[15],crsGA::Chromosome<Gen,ComputeFitness>,char[2]>
            (this_00,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/rafagaitan[P]crsga/include/crsGA/GeneticAlgorithm.hpp"
             ,0x88,(char (*) [9])"Fitness=",&local_34,(char (*) [15])" Chromosome: {",args_3,
             (char (*) [2])"}");
  return;
}

Assistant:

void reset()
    {
        _population.initializePopulation(_data.get());
        _population.calculateFitness(_data.get());
        LOG_DEBUG("Fitness=", _population.getFittestChromosome().getFitness(), " Chromosome: {", _population.getFittestChromosome(), "}");
    }